

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall Chainstate::TryAddBlockIndexCandidate(Chainstate *this,CBlockIndex *pindex)

{
  pointer ppCVar1;
  bool bVar2;
  Chainstate *pCVar3;
  CBlockIndex **ppCVar4;
  CBlockIndex *pCVar5;
  long in_FS_OFFSET;
  CBlockIndex *local_20;
  CBlockIndex *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar1 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_18 = pindex;
  if ((ppCVar1 !=
       (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
       _M_impl.super__Vector_impl_data._M_start) &&
     (pCVar5 = ppCVar1[-1], pCVar5 != (CBlockIndex *)0x0)) {
    bVar2 = ::node::CBlockIndexWorkComparator::operator()
                      ((CBlockIndexWorkComparator *)&local_20,pindex,pCVar5);
    if (bVar2) goto LAB_00ae06be;
  }
  pCVar3 = ChainstateManager::ActiveChainstate(this->m_chainman);
  if (pCVar3 != this) {
    if (this->m_disabled != false) goto LAB_00ae06be;
    pCVar3 = this->m_chainman->m_active_chainstate;
    if (pCVar3 == (Chainstate *)0x0) {
      local_20 = (CBlockIndex *)0x0;
    }
    else {
      local_20 = SnapshotBase(pCVar3);
    }
    ppCVar4 = inline_assertion_check<true,CBlockIndex_const*>
                        (&local_20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                         ,0xef5,"TryAddBlockIndexCandidate","m_chainman.GetSnapshotBaseBlock()");
    pCVar5 = CBlockIndex::GetAncestor(*ppCVar4,local_18->nHeight);
    if (pCVar5 != local_18) goto LAB_00ae06be;
  }
  std::
  _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
  ::_M_insert_unique<CBlockIndex*const&>
            ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
              *)&this->setBlockIndexCandidates,&local_18);
LAB_00ae06be:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::TryAddBlockIndexCandidate(CBlockIndex* pindex)
{
    AssertLockHeld(cs_main);
    // The block only is a candidate for the most-work-chain if it has the same
    // or more work than our current tip.
    if (m_chain.Tip() != nullptr && setBlockIndexCandidates.value_comp()(pindex, m_chain.Tip())) {
        return;
    }

    bool is_active_chainstate = this == &m_chainman.ActiveChainstate();
    if (is_active_chainstate) {
        // The active chainstate should always add entries that have more
        // work than the tip.
        setBlockIndexCandidates.insert(pindex);
    } else if (!m_disabled) {
        // For the background chainstate, we only consider connecting blocks
        // towards the snapshot base (which can't be nullptr or else we'll
        // never make progress).
        const CBlockIndex* snapshot_base{Assert(m_chainman.GetSnapshotBaseBlock())};
        if (snapshot_base->GetAncestor(pindex->nHeight) == pindex) {
            setBlockIndexCandidates.insert(pindex);
        }
    }
}